

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogAppInterfaceStd.h
# Opt level: O0

TaskId nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>::registerCurrentTask
                 (char *aTaskName)

{
  bool bVar1;
  reference puVar2;
  _Node_iterator_base<unsigned_char,_false> in_RDI;
  long in_FS_OFFSET;
  iterator begin;
  TaskId result;
  lock_guard<std::mutex> lock;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  undefined1 local_11;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffffb0,
             (mutex_type *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  bVar1 = std::
          unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
          ::empty((unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
                   *)0x10cea6);
  if (bVar1) {
    local_11 = 0xff;
  }
  else {
    std::
    unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
    ::begin((unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
             *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    puVar2 = std::__detail::_Node_iterator<unsigned_char,_true,_false>::operator*
                       ((_Node_iterator<unsigned_char,_true,_false> *)0x10cec9);
    local_11 = *puVar2;
    *(TaskId *)(in_FS_OFFSET + -0x30) = local_11;
    AppInterfaceStd<(unsigned_char)2,false,100ul>::shTaskName_abi_cxx11_();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffffb0,
               (char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    std::
    unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
    ::erase((unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
             *)in_stack_ffffffffffffffb0,(iterator)in_RDI._M_cur);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x10cf54);
  return local_11;
}

Assistant:

static TaskId registerCurrentTask(char const * const aTaskName) {
    std::lock_guard<std::mutex> lock (sRegistrationMutex);
    TaskId result;
    if(!sFreeTaskIds.empty()) {
      auto begin = sFreeTaskIds.begin();
      shTaskId = result = *begin;
      shTaskName = aTaskName;
      sFreeTaskIds.erase(begin);
    }
    else {
      result = csInvalidTaskId;
    }
    return result;
  }